

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

exr_result_t internal_exr_parse_header(_internal_exr_context *ctxt)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  exr_attr_string_t *s;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  exr_attr_float_vector_t *fv;
  exr_attr_tiledesc_t *peVar6;
  _internal_exr_part *curpart_00;
  undefined8 uVar7;
  exr_result_t eVar8;
  int iVar9;
  int iVar10;
  uint8_t *puVar11;
  exr_attribute_list_t *peVar12;
  ulong uVar13;
  exr_attr_box2i_t *peVar14;
  exr_attr_opaquedata_t *peVar15;
  uint uVar16;
  exr_attr_opaquedata_t *peVar17;
  exr_storage_t eVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  exr_attribute_t *attr;
  _internal_exr_part *p_Var22;
  exr_attribute_list_t *peVar23;
  long lVar24;
  uint64_t uVar25;
  exr_attribute_t **ppeVar26;
  bool bVar27;
  uint8_t maxval;
  int32_t iVar28;
  undefined4 uVar29;
  uint8_t **outsz;
  uint local_2f4;
  exr_attr_opaquedata_t *local_2f0;
  uint8_t next_byte;
  exr_attribute_list_t *local_2e0;
  uint8_t *outstr;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 aStack_2d0;
  _internal_exr_seq_scratch scratch;
  int local_284;
  exr_attribute_list_t *local_280;
  int32_t typelen;
  int32_t local_270;
  int32_t n;
  exr_attribute_t *nattr;
  _internal_exr_part *curpart;
  uint local_258;
  uint32_t flags;
  exr_attr_string_vector_t *local_250;
  uint8_t *strptr;
  uint64_t initpos;
  char name [256];
  char type [256];
  
  if (ctxt->silent_header != '\0') {
    ctxt->standard_error = silent_standard_error;
    ctxt->report_error = silent_error;
    ctxt->print_error = silent_print_error;
  }
  eVar8 = read_magic_and_flags(ctxt,&flags,&initpos);
  if (eVar8 == 0) {
    scratch.curpos = 0;
    scratch.navail = 0;
    scratch.fileoff = initpos;
    scratch.sequential_read = scratch_seq_read;
    scratch.sequential_skip = scratch_seq_skip;
    scratch.ctxt = ctxt;
    puVar11 = (uint8_t *)(*ctxt->alloc_fn)(0x1000);
    scratch.scratch = puVar11;
    if ((puVar11 != (uint8_t *)0x0) || (eVar8 = (*ctxt->standard_error)(ctxt,1), eVar8 == 0)) {
      curpart = *ctxt->parts;
      if (curpart == (_internal_exr_part *)0x0) {
        eVar8 = (*ctxt->report_error)(ctxt,3,"Error during file initialization");
      }
      else {
        eVar18 = EXR_STORAGE_SCANLINE;
        uVar16 = flags >> 0xb;
        ctxt->is_singlepart_tiled = (byte)(flags >> 9) & 1;
        ctxt->max_name_length = -(ctxt->strict_header == '\0') | -((flags >> 10 & 1) != 0) | 0x1f;
        ctxt->has_nonimage_data = (byte)uVar16 & 1;
        ctxt->is_multipart = (byte)(flags >> 0xc) & 1;
        if (((flags >> 9 & 1) == 0) ||
           (eVar18 = EXR_STORAGE_TILED, (uVar16 & 1) == 0 && (flags >> 0xc & 1) == 0)) {
LAB_00118d03:
          curpart->storage_mode = eVar18;
LAB_00118d0f:
          do {
            do {
              eVar8 = (*scratch.sequential_read)(&scratch,&next_byte,1);
              if (eVar8 != 0) {
                pcVar19 = "Unable to extract header byte";
LAB_0011aae8:
                eVar8 = (*ctxt->report_error)(ctxt,6,pcVar19);
LAB_0011aaf1:
                if (scratch.scratch != (uint8_t *)0x0) {
                  (*(scratch.ctxt)->free_fn)(scratch.scratch);
                }
                goto LAB_0011ab5a;
              }
              if (next_byte == '\0') {
                eVar8 = internal_exr_validate_read_part(ctxt,curpart);
                if (eVar8 != 0) goto LAB_0011aaf1;
                if (ctxt->is_multipart != '\0') {
                  eVar8 = (*scratch.sequential_read)(&scratch,&next_byte,1);
                  if (eVar8 != 0) {
                    pcVar19 = "Unable to go to next part definition";
                    goto LAB_0011aae8;
                  }
                  if (next_byte != '\0') {
                    eVar8 = internal_exr_add_part(ctxt,&curpart,(int *)0x0);
                    if (eVar8 == 0) goto LAB_00118d32;
                    goto LAB_00118eb6;
                  }
                }
                eVar8 = 3;
                if (ctxt->parts != (_internal_exr_part **)0x0) {
                  p_Var22 = *ctxt->parts;
                  p_Var22->chunk_table_offset = scratch.fileoff - scratch.navail;
                  lVar24 = 0;
                  goto LAB_0011aa31;
                }
                goto LAB_0011ab42;
              }
LAB_00118d32:
              p_Var22 = curpart;
              typelen = 0;
              local_2f4 = 0;
              nattr = (exr_attribute_t *)0x0;
              strptr = (uint8_t *)0x0;
              bVar3 = ctxt->max_name_length;
              name[0] = next_byte;
              local_270 = 1;
              eVar8 = read_text(ctxt,name,&local_270,(uint)bVar3,&scratch,"attribute name");
              if ((eVar8 != 0) ||
                 (eVar8 = read_text(ctxt,type,&typelen,(uint)bVar3,&scratch,"attribute type"),
                 eVar8 != 0)) goto LAB_00118eb6;
              if (local_270 == 0) {
                eVar8 = (*ctxt->report_error)
                                  (ctxt,6,"Invalid empty string encountered parsing attribute name")
                ;
                goto LAB_00118ead;
              }
              if (typelen == 0) {
                eVar8 = (*ctxt->print_error)
                                  (ctxt,6,
                                   "Invalid empty string encountered parsing attribute type for attribute \'%s\'"
                                   ,name);
                goto LAB_00118ead;
              }
              eVar8 = (*scratch.sequential_read)(&scratch,&local_2f4,4);
              uVar16 = local_2f4;
              if (eVar8 != 0) {
                pcVar19 = "Unable to read attribute size for attribute \'%s\', type \'%s\'";
                goto LAB_00118e77;
              }
              if (0x13 < (byte)name[0] - 99) goto switchD_00118eef_caseD_65;
              peVar15 = (exr_attr_opaquedata_t *)(ulong)local_2f4;
              peVar23 = (exr_attribute_list_t *)(long)(int)local_2f4;
              switch((uint)(byte)name[0]) {
              case 99:
                local_2f0 = peVar15;
                iVar9 = bcmp(name,"channels",9);
                if (iVar9 != 0) {
                  pcVar19 = "compression";
                  local_2e0 = peVar23;
                  iVar9 = bcmp(name,"compression",0xc);
                  if (iVar9 == 0) {
                    if (p_Var22->compression == (exr_attribute_t *)0x0) {
                      iVar9 = bcmp(type,"compression",0xc);
                      if (iVar9 != 0) goto LAB_00119662;
                      eVar8 = extract_attr_uint8(ctxt,&scratch,(uint8_t *)&outstr,"compression",type
                                                 ,(int32_t)local_2f0,'\n');
                      if (eVar8 != 0) goto LAB_00119a19;
                      eVar8 = exr_attr_list_add_static_name
                                        ((exr_context_t)ctxt,&p_Var22->attributes,"compression",
                                         EXR_ATTR_COMPRESSION,0,(uint8_t **)0x0,
                                         &p_Var22->compression);
                      if (eVar8 == 0) {
                        (p_Var22->compression->field_6).uc = (byte)outstr;
                        p_Var22->comp_type = (uint)(byte)outstr;
                        goto LAB_0011a8b5;
                      }
                      pcVar21 = "Unable to initialize attribute \'%s\', type \'compression\'";
                      pcVar19 = "compression";
                    }
                    else {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      eVar8 = 0xe;
                      pcVar21 = "Duplicate copy of required attribute \'%s\' encountered";
                      pcVar19 = "compression";
                    }
                  }
                  else {
                    iVar9 = bcmp(name,"chunkCount",0xb);
                    if (iVar9 != 0) break;
                    outstr = (uint8_t *)CONCAT44(outstr._4_4_,(int)local_2f0);
                    if (p_Var22->chunkCount != (exr_attribute_t *)0x0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      pcVar19 = "Duplicate copy of required attribute \'chunkCount\' encountered";
                      goto LAB_00119336;
                    }
                    if (type._0_4_ != 0x746e69) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      pcVar21 = "attribute \'chunkCount\': Invalid type \'%s\'";
                      goto LAB_00119a09;
                    }
                    if ((int)local_2f0 != 4) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      pcVar19 = "Required attribute \'chunkCount\': Invalid size %d (exp 4)";
                      peVar15 = local_2f0;
                      goto LAB_0011a4ec;
                    }
                    eVar8 = (*scratch.sequential_read)(&scratch,&outstr,4);
                    if (eVar8 != 0) {
                      pcVar19 = "Unable to read chunkCount data";
                      goto LAB_0011a76a;
                    }
                    eVar8 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&p_Var22->attributes,"chunkCount",
                                       EXR_ATTR_INT,0,(uint8_t **)0x0,&p_Var22->chunkCount);
                    if (eVar8 == 0) {
                      (p_Var22->chunkCount->field_6).i = (uint32_t)outstr;
                      p_Var22->chunk_count = (uint32_t)outstr;
                      goto LAB_0011a8b5;
                    }
                    pcVar21 = "Unable to initialize attribute \'%s\', type \'int\'";
                    pcVar19 = "chunkCount";
                  }
                  goto LAB_00119a11;
                }
                outstr = (uint8_t *)0x0;
                aStack_2d0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0x0;
                if (p_Var22->channels != (exr_attribute_t *)0x0) {
                  (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                  pcVar19 = "Duplicate copy of required attribute \'channels\' encountered";
                  goto LAB_00119336;
                }
                iVar9 = bcmp(type,"chlist",7);
                if (iVar9 != 0) {
                  (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                  pcVar21 = "Required attribute \'channels\': Invalid type \'%s\'";
                  goto LAB_00119983;
                }
                eVar8 = extract_attr_chlist(ctxt,&scratch,(exr_attr_chlist_t *)&outstr,"channels",
                                            type,(int32_t)local_2f0);
                if (eVar8 == 0) {
                  ppeVar26 = &p_Var22->channels;
                  eVar8 = exr_attr_list_add_static_name
                                    ((exr_context_t)ctxt,&p_Var22->attributes,"channels",
                                     EXR_ATTR_CHLIST,0,(uint8_t **)0x0,ppeVar26);
                  if (eVar8 != 0) {
                    exr_attr_chlist_destroy((exr_context_t)ctxt,(exr_attr_chlist_t *)&outstr);
                    pcVar21 = "Unable to initialize attribute \'%s\', type \'chlist\'";
                    pcVar19 = "channels";
                    goto LAB_00119a11;
                  }
                  exr_attr_chlist_destroy((exr_context_t)ctxt,((*ppeVar26)->field_6).chlist);
                  peVar14 = ((*ppeVar26)->field_6).box2i;
                  (peVar14->min).field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)outstr;
                  (peVar14->max).field_0 = aStack_2d0;
LAB_0011a8b5:
                  eVar8 = 0;
                }
                else {
                  exr_attr_chlist_destroy((exr_context_t)ctxt,(exr_attr_chlist_t *)&outstr);
                }
                goto LAB_00119a19;
              case 100:
                local_2f0 = peVar15;
                iVar9 = bcmp(name,"dataWindow",0xb);
                if (iVar9 == 0) {
                  outstr = (uint8_t *)0x0;
                  aStack_2d0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0x0;
                  if (p_Var22->dataWindow == (exr_attribute_t *)0x0) {
                    iVar9 = bcmp(type,"box2i",6);
                    if (iVar9 != 0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      pcVar19 = "dataWindow";
LAB_00119681:
                      eVar8 = (*ctxt->print_error)
                                        (ctxt,0x10,"Required attribute \'%s\': Invalid type \'%s\'",
                                         pcVar19);
                      goto LAB_00119a19;
                    }
                    eVar8 = extract_attr_32bit(ctxt,&scratch,&outstr,"dataWindow",type,
                                               (int32_t)local_2f0,4);
                    if (eVar8 != 0) goto LAB_00119a19;
                    eVar8 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&p_Var22->attributes,"dataWindow",
                                       EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&p_Var22->dataWindow);
                    if (eVar8 == 0) {
                      peVar14 = (p_Var22->dataWindow->field_6).box2i;
                      (peVar14->min).field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)outstr;
                      (peVar14->max).field_0 = aStack_2d0;
                      (p_Var22->data_window).min.field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)outstr;
                      (p_Var22->data_window).max.field_0 = aStack_2d0;
                      goto LAB_0011a8b5;
                    }
                    pcVar21 = "Unable to initialize attribute \'%s\', type \'box2i\'";
                  }
                  else {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    eVar8 = 0xe;
                    pcVar21 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar19 = "dataWindow";
                }
                else {
                  iVar9 = bcmp(name,"displayWindow",0xe);
                  if (iVar9 != 0) break;
                  outstr = (uint8_t *)0x0;
                  aStack_2d0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0x0;
                  if (p_Var22->displayWindow == (exr_attribute_t *)0x0) {
                    iVar9 = bcmp(type,"box2i",6);
                    if (iVar9 != 0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      pcVar19 = "displayWindow";
                      goto LAB_00119681;
                    }
                    eVar8 = extract_attr_32bit(ctxt,&scratch,&outstr,"displayWindow",type,
                                               (int32_t)local_2f0,4);
                    if (eVar8 != 0) goto LAB_00119a19;
                    eVar8 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&p_Var22->attributes,"displayWindow",
                                       EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&p_Var22->displayWindow);
                    if (eVar8 == 0) {
                      peVar14 = (p_Var22->displayWindow->field_6).box2i;
                      (peVar14->min).field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)outstr;
                      (peVar14->max).field_0 = aStack_2d0;
                      (p_Var22->display_window).min.field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)outstr;
                      (p_Var22->display_window).max.field_0 = aStack_2d0;
                      goto LAB_0011a8b5;
                    }
                    pcVar21 = "Unable to initialize attribute \'%s\', type \'box2i\'";
                  }
                  else {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    eVar8 = 0xe;
                    pcVar21 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar19 = "displayWindow";
                }
                goto LAB_00119a11;
              case 0x6c:
                iVar9 = bcmp(name,"lineOrder",10);
                if (iVar9 == 0) {
                  if (p_Var22->lineOrder == (exr_attribute_t *)0x0) {
                    pcVar19 = "lineOrder";
                    local_2f0 = peVar15;
                    local_2e0 = peVar23;
                    iVar9 = bcmp(type,"lineOrder",10);
                    if (iVar9 != 0) {
LAB_00119662:
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      goto LAB_00119681;
                    }
                    eVar8 = extract_attr_uint8(ctxt,&scratch,(uint8_t *)&outstr,"lineOrder",type,
                                               (int32_t)local_2f0,'\x03');
                    if (eVar8 != 0) goto LAB_00119a19;
                    eVar8 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&p_Var22->attributes,"lineOrder",
                                       EXR_ATTR_LINEORDER,0,(uint8_t **)0x0,&p_Var22->lineOrder);
                    if (eVar8 == 0) {
                      (p_Var22->lineOrder->field_6).uc = (byte)outstr;
                      p_Var22->lineorder = (uint)(byte)outstr;
                      goto LAB_0011a8b5;
                    }
                    pcVar21 = "Unable to initialize attribute \'%s\', type \'lineOrder\'";
                  }
                  else {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    eVar8 = 0xe;
                    pcVar21 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar19 = "lineOrder";
                  goto LAB_00119a11;
                }
                break;
              case 0x6e:
                iVar9 = bcmp(name,"name",5);
                if (iVar9 == 0) {
                  local_2e0 = peVar23;
                  eVar8 = check_bad_attrsz(ctxt,&scratch,uVar16,1,"name",type,&n);
                  if (eVar8 == 0) {
                    if (p_Var22->name != (exr_attribute_t *)0x0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      pcVar19 = "Duplicate copy of required attribute \'name\' encountered";
                      goto LAB_00119336;
                    }
                    iVar9 = bcmp(type,"string",7);
                    if (iVar9 != 0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      pcVar21 = "attribute \'name\': Invalid type \'%s\'";
                      goto LAB_00119983;
                    }
                    local_2f0 = (exr_attr_opaquedata_t *)&p_Var22->name;
                    peVar23 = &p_Var22->attributes;
                    eVar8 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,peVar23,"name",EXR_ATTR_STRING,uVar16 + 1
                                       ,&outstr,(exr_attribute_t **)local_2f0);
                    if (eVar8 != 0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      pcVar21 = "Unable to initialize attribute \'%s\', type \'string\'";
                      pcVar19 = "name";
                      goto LAB_00119a11;
                    }
                    eVar8 = (*scratch.sequential_read)(&scratch,outstr,(uint64_t)local_2e0);
                    if (eVar8 == 0) {
                      outstr[(long)local_2e0] = '\0';
                      eVar8 = exr_attr_string_init_static_with_length
                                        ((exr_context_t)ctxt,
                                         *(exr_attr_string_t **)(*(long *)local_2f0 + 0x18),
                                         (char *)outstr,uVar16);
                      if (eVar8 == 0) goto LAB_0011a8b5;
                    }
                    attr = *(exr_attribute_t **)local_2f0;
                    peVar15 = local_2f0;
LAB_0011a753:
                    exr_attr_list_remove((exr_context_t)ctxt,peVar23,attr);
                    peVar15->size = 0;
                    peVar15->unpacked_size = 0;
                    pcVar19 = "Unable to read \'name\' data";
LAB_0011a76a:
                    eVar8 = (*ctxt->report_error)(ctxt,eVar8,pcVar19);
                  }
                  goto LAB_00119a19;
                }
                break;
              case 0x70:
                iVar9 = bcmp(name,"pixelAspectRatio",0x11);
                if (iVar9 == 0) {
                  if (p_Var22->pixelAspectRatio == (exr_attribute_t *)0x0) {
                    local_2f0 = peVar15;
                    iVar9 = bcmp(type,"float",6);
                    if (iVar9 != 0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      pcVar19 = "pixelAspectRatio";
                      goto LAB_00119681;
                    }
                    if ((int)local_2f0 != 4) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      eVar8 = 0x11;
                      pcVar21 = "Required attribute \'%s\': Invalid size %d (exp 4)";
                      pcVar19 = "pixelAspectRatio";
                      goto LAB_0011a2fb;
                    }
                    eVar8 = (*scratch.sequential_read)(&scratch,&outstr,4);
                    if (eVar8 != 0) {
                      pcVar19 = "pixelAspectRatio";
                      goto LAB_001198d3;
                    }
                    ppeVar26 = &p_Var22->pixelAspectRatio;
                    eVar8 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&p_Var22->attributes,"pixelAspectRatio",
                                       EXR_ATTR_FLOAT,0,(uint8_t **)0x0,ppeVar26);
                    if (eVar8 == 0) {
LAB_0011a66c:
                      ((*ppeVar26)->field_6).i = (uint32_t)outstr;
                      goto LAB_0011a8b5;
                    }
                    pcVar21 = "Unable to initialize attribute \'%s\', type \'float\'";
                  }
                  else {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    eVar8 = 0xe;
                    pcVar21 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar19 = "pixelAspectRatio";
                  goto LAB_00119a11;
                }
                break;
              case 0x73:
                local_2f0 = peVar15;
                iVar9 = bcmp(name,"screenWindowCenter",0x13);
                if (iVar9 == 0) {
                  if (p_Var22->screenWindowCenter == (exr_attribute_t *)0x0) {
                    if (type._0_4_ != 0x663276) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      pcVar19 = "screenWindowCenter";
                      goto LAB_00119681;
                    }
                    if ((int)local_2f0 != 8) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      eVar8 = (*ctxt->print_error)
                                        (ctxt,0x11,
                                         "Required attribute \'%s\': Invalid size %d (exp %lu)",
                                         "screenWindowCenter");
                      goto LAB_00119a19;
                    }
                    eVar8 = (*scratch.sequential_read)(&scratch,&outstr,8);
                    if (eVar8 != 0) {
                      pcVar19 = "screenWindowCenter";
LAB_001198d3:
                      pcVar21 = "Attribute \'%s\': Unable to read data (%d bytes)";
                      goto LAB_0011a2fb;
                    }
                    eVar8 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&p_Var22->attributes,"screenWindowCenter"
                                       ,EXR_ATTR_V2F,0,(uint8_t **)0x0,&p_Var22->screenWindowCenter)
                    ;
                    if (eVar8 == 0) {
                      peVar14 = (p_Var22->screenWindowCenter->field_6).box2i;
LAB_0011a7e8:
                      (peVar14->min).field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)outstr;
                      goto LAB_0011a8b5;
                    }
                    pcVar21 = "Unable to initialize attribute \'%s\', type \'v2f\'";
                  }
                  else {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    eVar8 = 0xe;
                    pcVar21 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar19 = "screenWindowCenter";
                }
                else {
                  iVar9 = bcmp(name,"screenWindowWidth",0x12);
                  if (iVar9 != 0) break;
                  if (p_Var22->screenWindowWidth == (exr_attribute_t *)0x0) {
                    iVar9 = bcmp(type,"float",6);
                    if (iVar9 != 0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      pcVar19 = "screenWindowWidth";
                      goto LAB_00119681;
                    }
                    if ((int)local_2f0 != 4) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      eVar8 = 0x11;
                      pcVar21 = "Required attribute \'%s\': Invalid size %d (exp 4)";
                      pcVar19 = "screenWindowWidth";
LAB_0011a2fb:
                      eVar8 = (*ctxt->print_error)(ctxt,eVar8,pcVar21,pcVar19);
                      goto LAB_00119a19;
                    }
                    eVar8 = (*scratch.sequential_read)(&scratch,&outstr,4);
                    if (eVar8 != 0) {
                      pcVar19 = "screenWindowWidth";
                      goto LAB_001198d3;
                    }
                    ppeVar26 = &p_Var22->screenWindowWidth;
                    eVar8 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&p_Var22->attributes,"screenWindowWidth",
                                       EXR_ATTR_FLOAT,0,(uint8_t **)0x0,ppeVar26);
                    if (eVar8 == 0) goto LAB_0011a66c;
                    pcVar21 = "Unable to initialize attribute \'%s\', type \'float\'";
                  }
                  else {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    eVar8 = 0xe;
                    pcVar21 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar19 = "screenWindowWidth";
                }
LAB_00119a11:
                eVar8 = (*ctxt->print_error)(ctxt,eVar8,pcVar21,pcVar19);
                goto LAB_00119a19;
              case 0x74:
                local_2f0 = peVar15;
                iVar9 = bcmp(name,"tiles",6);
                if (iVar9 == 0) {
                  outstr = (uint8_t *)0x0;
                  aStack_2d0.field_0 = aStack_2d0.field_0 & 0xffffffffffffff00;
                  if (p_Var22->tiles == (exr_attribute_t *)0x0) {
                    iVar9 = bcmp(type,"tiledesc",9);
                    peVar15 = local_2f0;
                    if (iVar9 != 0) {
                      (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                      pcVar21 = "Required attribute \'tiles\': Invalid type \'%s\'";
LAB_00119983:
                      eVar8 = 0x10;
                      pcVar19 = type;
                      goto LAB_00119a11;
                    }
                    if ((int)local_2f0 == 9) {
                      eVar8 = (*scratch.sequential_read)(&scratch,&outstr,9);
                      if (eVar8 != 0) {
                        pcVar19 = "Unable to read \'tiles\' data";
                        goto LAB_0011a76a;
                      }
                      eVar8 = exr_attr_list_add_static_name
                                        ((exr_context_t)ctxt,&p_Var22->attributes,"tiles",
                                         EXR_ATTR_TILEDESC,0,(uint8_t **)0x0,&p_Var22->tiles);
                      if (eVar8 == 0) {
                        peVar14 = (exr_attr_box2i_t *)(p_Var22->tiles->field_6).tiledesc;
                        *(undefined1 *)&(peVar14->max).field_0 = aStack_2d0._0_1_;
                        goto LAB_0011a7e8;
                      }
                      pcVar21 = "Unable to initialize attribute \'%s\', type \'tiledesc\'";
                      pcVar19 = "tiles";
                      goto LAB_00119a11;
                    }
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    eVar8 = (*ctxt->print_error)
                                      (ctxt,0x10,
                                       "Required attribute \'tiles\': Invalid size %d (exp %lu)",
                                       (ulong)peVar15 & 0xffffffff);
                  }
                  else {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    pcVar19 = "Duplicate copy of required attribute \'tiles\' encountered";
LAB_00119336:
                    eVar8 = (*ctxt->print_error)(ctxt,0xe,pcVar19);
                  }
                }
                else {
                  iVar9 = bcmp(name,"type",5);
                  if (iVar9 != 0) break;
                  local_2e0 = peVar23;
                  eVar8 = check_bad_attrsz(ctxt,&scratch,(int32_t)local_2f0,1,"type",type,&n);
                  if (eVar8 == 0) {
                    if (p_Var22->type == (exr_attribute_t *)0x0) {
                      iVar9 = bcmp(type,"string",7);
                      if (iVar9 == 0) {
                        peVar15 = (exr_attr_opaquedata_t *)&p_Var22->type;
                        local_280 = &p_Var22->attributes;
                        eVar8 = exr_attr_list_add_static_name
                                          ((exr_context_t)ctxt,local_280,"type",EXR_ATTR_STRING,
                                           (int)local_2f0 + 1,&outstr,(exr_attribute_t **)peVar15);
                        if (eVar8 == 0) {
                          eVar8 = (*scratch.sequential_read)(&scratch,outstr,(uint64_t)local_2e0);
                          if (eVar8 == 0) {
                            outstr[(long)local_2e0] = '\0';
                            eVar8 = exr_attr_string_init_static_with_length
                                              ((exr_context_t)ctxt,
                                               ((*(exr_attribute_t **)peVar15)->field_6).string,
                                               (char *)outstr,(int32_t)local_2f0);
                            puVar11 = outstr;
                            if (eVar8 == 0) {
                              iVar9 = strcmp((char *)outstr,"scanlineimage");
                              if (iVar9 == 0) {
                                p_Var22->storage_mode = EXR_STORAGE_SCANLINE;
                              }
                              else {
                                iVar9 = strcmp((char *)puVar11,"tiledimage");
                                if (iVar9 == 0) {
                                  p_Var22->storage_mode = EXR_STORAGE_TILED;
                                }
                                else {
                                  iVar9 = strcmp((char *)puVar11,"deepscanline");
                                  if (iVar9 == 0) {
                                    p_Var22->storage_mode = EXR_STORAGE_DEEP_SCANLINE;
                                  }
                                  else {
                                    iVar9 = strcmp((char *)puVar11,"deeptile");
                                    if (iVar9 != 0) {
                                      eVar8 = (*ctxt->print_error)
                                                        (ctxt,0xe,
                                                  "attribute \'type\': Invalid type string \'%s\'",
                                                  puVar11);
                                      exr_attr_list_remove
                                                ((exr_context_t)ctxt,local_280,
                                                 *(exr_attribute_t **)peVar15);
                                      *(exr_attribute_t **)peVar15 = (exr_attribute_t *)0x0;
                                      goto LAB_00119a19;
                                    }
                                    p_Var22->storage_mode = EXR_STORAGE_DEEP_TILED;
                                  }
                                }
                              }
                              goto LAB_0011a8b5;
                            }
                          }
                          attr = *(exr_attribute_t **)peVar15;
                          peVar23 = local_280;
                          goto LAB_0011a753;
                        }
                        (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                        pcVar21 = "Unable to initialize attribute \'%s\', type \'string\'";
                        pcVar19 = "type";
                        goto LAB_00119a11;
                      }
                      (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                      pcVar21 = "Required attribute \'type\': Invalid type \'%s\'";
                      goto LAB_00119983;
                    }
                    (*scratch.sequential_skip)(&scratch,(uint64_t)local_2e0);
                    pcVar19 = "Duplicate copy of required attribute \'type\' encountered";
                    goto LAB_00119336;
                  }
                }
LAB_00119a19:
                if (eVar8 == 0x20) break;
                goto LAB_00118ead;
              case 0x76:
                if (CONCAT71(name._1_7_,name[0]) == 0x6e6f6973726576) {
                  outstr = (uint8_t *)CONCAT44(outstr._4_4_,local_2f4);
                  if (p_Var22->version != (exr_attribute_t *)0x0) {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    pcVar19 = "Duplicate copy of required attribute \'version\' encountered";
                    goto LAB_00119336;
                  }
                  if (type._0_4_ != 0x746e69) {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    pcVar21 = "attribute \'version\': Invalid type \'%s\'";
LAB_00119a09:
                    eVar8 = 0x10;
                    pcVar19 = type;
                    goto LAB_00119a11;
                  }
                  if (local_2f4 == 4) {
                    eVar8 = (*scratch.sequential_read)(&scratch,&outstr,4);
                    if (eVar8 != 0) {
                      pcVar19 = "Unable to read version data";
                      goto LAB_0011a76a;
                    }
                    if ((uint32_t)outstr == 1) {
                      eVar8 = exr_attr_list_add_static_name
                                        ((exr_context_t)ctxt,&p_Var22->attributes,"version",
                                         EXR_ATTR_INT,0,(uint8_t **)0x0,&p_Var22->version);
                      if (eVar8 == 0) {
                        (p_Var22->version->field_6).i = (uint32_t)outstr;
                        goto LAB_0011a8b5;
                      }
                      pcVar21 = "Unable to initialize attribute \'%s\', type \'int\'";
                      pcVar19 = "version";
                      goto LAB_00119a11;
                    }
                    pcVar19 = "Invalid version %d: expect 1";
                    peVar15 = (exr_attr_opaquedata_t *)((ulong)outstr & 0xffffffff);
                  }
                  else {
                    (*scratch.sequential_skip)(&scratch,(uint64_t)peVar23);
                    pcVar19 = "attribute \'version\': Invalid size %d (exp 4)";
                  }
LAB_0011a4ec:
                  eVar8 = (*ctxt->print_error)(ctxt,0xe,pcVar19,peVar15);
                  goto LAB_00119a19;
                }
              }
switchD_00118eef_caseD_65:
              iVar9 = bcmp(type,"string",7);
              if (iVar9 == 0) {
                eVar8 = check_bad_attrsz(ctxt,&scratch,local_2f4,1,name,type,(int32_t *)&outstr);
                if (eVar8 == 0) {
                  ppeVar26 = &nattr;
                  eVar8 = exr_attr_list_add((exr_context_t)ctxt,&p_Var22->attributes,name,
                                            EXR_ATTR_STRING,(uint32_t)outstr + 1,&strptr,ppeVar26);
                  goto LAB_00119a6a;
                }
                goto LAB_00118eb6;
              }
              ppeVar26 = &nattr;
              eVar8 = exr_attr_list_add_by_type
                                ((exr_context_t)ctxt,&p_Var22->attributes,name,type,0,
                                 (uint8_t **)0x0,ppeVar26);
LAB_00119a6a:
              puVar11 = strptr;
              uVar16 = local_2f4;
              pcVar19 = type;
              if (eVar8 != 0) {
                pcVar19 = "Unable to initialize attribute \'%s\', type \'%s\'";
LAB_00118e77:
                eVar8 = (*ctxt->print_error)(ctxt,eVar8,pcVar19,name,type);
LAB_00118ead:
                if (eVar8 != 0) goto LAB_00118eb6;
                goto LAB_00118d0f;
              }
              pcVar21 = name;
              switch(nattr->type) {
              case EXR_ATTR_BOX2I:
              case EXR_ATTR_BOX2F:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 4;
                goto LAB_00119e1b;
              case EXR_ATTR_CHLIST:
                eVar8 = extract_attr_chlist(ctxt,&scratch,(nattr->field_6).chlist,name,type,
                                            local_2f4);
                break;
              case EXR_ATTR_CHROMATICITIES:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 8;
                goto LAB_00119e1b;
              case EXR_ATTR_COMPRESSION:
                maxval = '\n';
                goto LAB_00119dbd;
              case EXR_ATTR_DOUBLE:
                peVar14 = (exr_attr_box2i_t *)&nattr->field_6;
                iVar28 = 1;
                goto LAB_00119dec;
              case EXR_ATTR_ENVMAP:
                maxval = '\x02';
                goto LAB_00119dbd;
              case EXR_ATTR_FLOAT:
              case EXR_ATTR_INT:
                peVar14 = (exr_attr_box2i_t *)&nattr->field_6;
                iVar28 = 1;
                goto LAB_00119e1b;
              case EXR_ATTR_FLOAT_VECTOR:
                fv = (nattr->field_6).floatvector;
                outstr = (uint8_t *)((ulong)outstr & 0xffffffff00000000);
                local_2f0 = (exr_attr_opaquedata_t *)CONCAT44(local_2f0._4_4_,local_2f4);
                eVar8 = check_bad_attrsz(ctxt,&scratch,local_2f4,4,pcVar21,type,(int32_t *)&outstr);
                exr_attr_float_vector_destroy((exr_context_t)ctxt,fv);
                if ((0 < (int)(uint32_t)outstr && eVar8 == 0) &&
                   (eVar8 = exr_attr_float_vector_init((exr_context_t)ctxt,fv,(uint32_t)outstr),
                   eVar8 == 0)) {
                  eVar8 = (*scratch.sequential_read)(&scratch,fv->arr,(long)(int)local_2f0);
                  if (eVar8 == 0) goto LAB_0011a7af;
                  exr_attr_float_vector_destroy((exr_context_t)ctxt,fv);
                  pcVar20 = "Unable to read \'%s\' %s data";
                  eVar8 = 10;
                  pcVar19 = name;
                  pcVar21 = type;
                  goto LAB_0011a116;
                }
                break;
              case EXR_ATTR_KEYCODE:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 7;
                goto LAB_00119e1b;
              case EXR_ATTR_LINEORDER:
                maxval = '\x03';
LAB_00119dbd:
                eVar8 = extract_attr_uint8(ctxt,&scratch,&(nattr->field_6).uc,name,type,local_2f4,
                                           maxval);
                break;
              case EXR_ATTR_M33F:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 9;
                goto LAB_00119e1b;
              case EXR_ATTR_M33D:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 9;
                goto LAB_00119dec;
              case EXR_ATTR_M44F:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 0x10;
                goto LAB_00119e1b;
              case EXR_ATTR_M44D:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 0x10;
                goto LAB_00119dec;
              case EXR_ATTR_PREVIEW:
                local_2f0 = (exr_attr_opaquedata_t *)(nattr->field_6).preview;
                peVar23 = (exr_attribute_list_t *)(long)(int)local_2f4;
                uVar5 = ctxt->file_size;
                exr_attr_preview_destroy((exr_context_t)ctxt,(exr_attr_preview_t *)local_2f0);
                if ((long)peVar23 < 8) {
                  pcVar19 = "Attribute \'%s\': Invalid size %d (exp \'%s\' size >= 8)";
                  eVar8 = 0x11;
                  peVar23 = (exr_attribute_list_t *)(ulong)uVar16;
LAB_0011a17f:
                  eVar8 = (*ctxt->print_error)(ctxt,eVar8,pcVar19,name,peVar23,type,ppeVar26);
                }
                else {
                  local_2e0 = peVar23;
                  eVar8 = (*scratch.sequential_read)(&scratch,&outstr,8);
                  if (eVar8 == 0) {
                    uVar13 = (ulong)((uint32_t)outstr * outstr._4_4_ * 4);
                    uVar29 = (undefined4)((ulong)ppeVar26 >> 0x20);
                    if ((exr_attribute_list_t *)(uVar13 + 8) != local_2e0) {
                      ppeVar26 = (exr_attribute_t **)CONCAT44(uVar29,(uint32_t)outstr);
                      pcVar19 = 
                      "Attribute \'%s\': Invalid size %d (exp \'%s\' %u x %u * 4 + sizevals)";
                      eVar8 = 0xe;
                      peVar23 = local_2e0;
                      goto LAB_0011a17f;
                    }
                    if ((uVar13 == 0) || ((0 < (long)uVar5 && (uVar5 <= uVar13)))) {
                      outsz = (uint8_t **)CONCAT44(uVar29,outstr._4_4_);
                      pcVar19 = "Attribute \'%s\', type \'%s\': Invalid size for preview %u x %u";
                      eVar8 = 0x11;
                      uVar16 = (uint32_t)outstr;
                      goto LAB_0011a3ba;
                    }
                    eVar8 = exr_attr_preview_init
                                      ((exr_context_t)ctxt,(exr_attr_preview_t *)local_2f0,
                                       (uint32_t)outstr,outstr._4_4_);
                    if (eVar8 == 0) {
                      eVar8 = (*scratch.sequential_read)
                                        (&scratch,local_2f0->packed_data,
                                         (ulong)((uint32_t)outstr * outstr._4_4_ * 4));
                      if (eVar8 != 0) {
                        exr_attr_preview_destroy
                                  ((exr_context_t)ctxt,(exr_attr_preview_t *)local_2f0);
                        pcVar19 = "Attribute \'%s\': Unable to read preview data (%d bytes)";
                        peVar23 = local_2e0;
                        goto LAB_0011a629;
                      }
                      goto LAB_0011a7af;
                    }
                  }
                  else {
                    eVar8 = (*ctxt->print_error)
                                      (ctxt,eVar8,"Attribute \'%s\': Unable to read preview sizes",
                                       name);
                  }
                }
                break;
              case EXR_ATTR_RATIONAL:
              case EXR_ATTR_TIMECODE:
              case EXR_ATTR_V2I:
              case EXR_ATTR_V2F:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 2;
                goto LAB_00119e1b;
              case EXR_ATTR_STRING:
                local_2f0 = (exr_attr_opaquedata_t *)(nattr->field_6).string;
                uVar25 = (uint64_t)(int)local_2f4;
                eVar8 = (*scratch.sequential_read)(&scratch,strptr,uVar25);
                if (eVar8 != 0) {
LAB_0011a0fa:
                  pcVar20 = "Unable to read \'%s\' %s data";
                  pcVar19 = name;
                  pcVar21 = type;
                  goto LAB_0011a116;
                }
                puVar11[uVar25] = '\0';
                eVar8 = exr_attr_string_init_static_with_length
                                  ((exr_context_t)ctxt,(exr_attr_string_t *)local_2f0,
                                   (char *)puVar11,uVar16);
                break;
              case EXR_ATTR_STRING_VECTOR:
                local_250 = (nattr->field_6).stringvector;
                outstr = (uint8_t *)0x0;
                aStack_2d0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0x0;
                local_258 = local_2f4;
                eVar8 = check_bad_attrsz(ctxt,&scratch,local_2f4,1,pcVar21,type,&n);
                if (eVar8 == 0) {
                  local_2e0 = (exr_attribute_list_t *)((ulong)local_2e0 & 0xffffffff00000000);
                  peVar15 = (exr_attr_opaquedata_t *)0x0;
                  peVar23 = (exr_attribute_list_t *)0x0;
                  for (iVar9 = 0; iVar9 < (int)local_258; iVar9 = iVar9 + 4 + local_284) {
                    local_284 = 0;
                    eVar8 = (*scratch.sequential_read)(&scratch,&local_284,4);
                    if (eVar8 != 0) {
                      local_2e0 = peVar23;
                      eVar8 = (*ctxt->print_error)
                                        (ctxt,eVar8,"Attribute \'%s\': Unable to read string length"
                                         ,name);
                      local_2f0 = peVar15;
LAB_0011a8d6:
                      peVar17 = (exr_attr_opaquedata_t *)0x0;
                      peVar15 = (exr_attr_opaquedata_t *)((ulong)local_2f0 & 0xffffffff);
                      if ((int)local_2f0 < 1) {
                        peVar15 = peVar17;
                      }
                      local_2f0 = (exr_attr_opaquedata_t *)((long)peVar15 << 4);
                      for (; local_2f0 != peVar17;
                          peVar17 = (exr_attr_opaquedata_t *)&peVar17->packed_data) {
                        exr_attr_string_destroy
                                  ((exr_context_t)ctxt,
                                   (exr_attr_string_t *)
                                   (peVar17->pad + (long)((long)&local_2e0[-1].entries + 4)));
                      }
                      if (local_2e0 != (exr_attribute_list_t *)0x0) {
                        (*ctxt->free_fn)(local_2e0);
                      }
                      goto LAB_00119e3b;
                    }
                    if (((long)local_284 < 0) ||
                       (ctxt->file_size < (long)local_284 && 0 < ctxt->file_size)) {
                      local_2e0 = peVar23;
                      eVar8 = (*ctxt->print_error)
                                        (ctxt,0xe,
                                         "Attribute \'%s\': Invalid size (%d) encountered parsing string vector"
                                         ,name);
                      local_2f0 = peVar15;
                      goto LAB_0011a8d6;
                    }
                    iVar10 = (int)local_2e0;
                    if ((int)local_2e0 == 0) {
                      peVar23 = (exr_attribute_list_t *)(*ctxt->alloc_fn)(0x40);
                      iVar10 = 4;
                      if (peVar23 == (exr_attribute_list_t *)0x0) {
                        eVar8 = (*ctxt->standard_error)(ctxt,1);
                        local_2e0 = (exr_attribute_list_t *)0x0;
                        local_2f0 = peVar15;
                        goto LAB_0011a8d6;
                      }
                    }
                    local_2f0 = (exr_attr_opaquedata_t *)((long)&peVar15->size + 1);
                    if ((int)local_2f0 < iVar10) {
                      local_2e0 = (exr_attribute_list_t *)CONCAT44(local_2e0._4_4_,iVar10);
                      peVar12 = peVar23;
                    }
                    else {
                      local_2e0 = (exr_attribute_list_t *)CONCAT44(local_2e0._4_4_,iVar10 * 2);
                      peVar12 = (exr_attribute_list_t *)(*ctxt->alloc_fn)((long)(iVar10 * 2) << 4);
                      if (peVar12 == (exr_attribute_list_t *)0x0) {
                        local_2e0 = peVar23;
                        eVar8 = (*ctxt->standard_error)(ctxt,1);
                        local_2f0 = peVar15;
                        goto LAB_0011a8d6;
                      }
                      lVar24 = 0;
                      peVar17 = peVar15;
                      while (bVar27 = peVar17 != (exr_attr_opaquedata_t *)0x0,
                            peVar17 = (exr_attr_opaquedata_t *)
                                      ((long)&peVar17[-1].destroy_unpacked_func_ptr + 7), bVar27) {
                        puVar1 = (undefined8 *)((long)&peVar23->num_attributes + lVar24);
                        uVar7 = puVar1[1];
                        puVar2 = (undefined8 *)((long)&peVar12->num_attributes + lVar24);
                        *puVar2 = *puVar1;
                        puVar2[1] = uVar7;
                        lVar24 = lVar24 + 0x10;
                      }
                      (*ctxt->free_fn)(peVar23);
                    }
                    s = (exr_attr_string_t *)(&peVar12->num_attributes + (long)peVar15 * 4);
                    *(uint8_t **)(&peVar12->num_attributes + (long)peVar15 * 4) = outstr;
                    *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)
                     (&peVar12->num_attributes + (long)peVar15 * 4 + 2) = aStack_2d0;
                    local_280 = peVar12;
                    eVar8 = exr_attr_string_init((exr_context_t)ctxt,s,local_284);
                    if (eVar8 != 0) {
LAB_0011a80e:
                      local_2e0 = local_280;
                      goto LAB_0011a8d6;
                    }
                    eVar8 = (*scratch.sequential_read)(&scratch,s->str,(long)local_284);
                    if (eVar8 != 0) {
                      eVar8 = (*ctxt->print_error)
                                        (ctxt,eVar8,
                                         "Attribute \'%s\': Unable to read string of length (%d)",
                                         name);
                      goto LAB_0011a80e;
                    }
                    s->str[local_284] = '\0';
                    peVar15 = local_2f0;
                    peVar23 = local_280;
                  }
                  exr_attr_string_vector_destroy((exr_context_t)ctxt,local_250);
                  local_250->n_strings = (int32_t)peVar15;
                  local_250->alloc_size = (int)local_2e0;
                  local_250->strings = (exr_attr_string_t *)peVar23;
LAB_0011a7af:
                  eVar8 = 0;
                }
                break;
              case EXR_ATTR_TILEDESC:
                if (local_2f4 != 9) {
                  ppeVar26 = (exr_attribute_t **)CONCAT44((int)((ulong)ppeVar26 >> 0x20),9);
                  pcVar19 = "Attribute \'%s\': Invalid size %d (exp \'%s\' size %d)";
                  eVar8 = 0x11;
                  peVar23 = (exr_attribute_list_t *)(ulong)local_2f4;
                  goto LAB_0011a17f;
                }
                peVar6 = (nattr->field_6).tiledesc;
                eVar8 = (*scratch.sequential_read)(&scratch,peVar6,9);
                if (eVar8 != 0) goto LAB_0011a0fa;
                bVar3 = peVar6->level_and_round;
                if ((bVar3 & 0xf) < 3) {
                  if (bVar3 < 0x20) goto LAB_00118d0f;
                  pcVar19 = 
                  "Attribute \'%s\': Invalid tile rounding specification encountered: found enum %d"
                  ;
                  eVar8 = 0xe;
                  peVar23 = (exr_attribute_list_t *)(ulong)(bVar3 >> 4);
                }
                else {
                  pcVar19 = 
                  "Attribute \'%s\': Invalid tile level specification encountered: found enum %d";
                  eVar8 = 0xe;
                  peVar23 = (exr_attribute_list_t *)(ulong)(bVar3 & 0xf);
                }
LAB_0011a629:
                eVar8 = (*ctxt->print_error)(ctxt,eVar8,pcVar19,name,peVar23);
                break;
              case EXR_ATTR_V2D:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 2;
                goto LAB_00119dec;
              case EXR_ATTR_V3I:
              case EXR_ATTR_V3F:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 3;
LAB_00119e1b:
                eVar8 = extract_attr_32bit(ctxt,&scratch,peVar14,name,type,local_2f4,iVar28);
                break;
              case EXR_ATTR_V3D:
                peVar14 = (nattr->field_6).box2i;
                iVar28 = 3;
LAB_00119dec:
                eVar8 = extract_attr_64bit(ctxt,&scratch,peVar14,name,type,local_2f4,iVar28);
                break;
              case EXR_ATTR_OPAQUE:
                local_2f0 = (nattr->field_6).opaque;
                outsz = &outstr;
                eVar8 = check_bad_attrsz(ctxt,&scratch,local_2f4,1,pcVar21,type,(int32_t *)outsz);
                peVar15 = local_2f0;
                if (eVar8 == 0) {
                  exr_attr_opaquedata_destroy((exr_context_t)ctxt,local_2f0);
                  local_2e0 = (exr_attribute_list_t *)(long)(int)uVar16;
                  eVar8 = exr_attr_opaquedata_init
                                    ((exr_context_t)ctxt,peVar15,(size_t)(long)(int)uVar16);
                  if (eVar8 == 0) {
                    eVar8 = (*scratch.sequential_read)
                                      (&scratch,local_2f0->packed_data,(uint64_t)local_2e0);
                    if (eVar8 == 0) goto LAB_0011a7af;
                    exr_attr_opaquedata_destroy((exr_context_t)ctxt,local_2f0);
                    pcVar19 = "Attribute \'%s\': Unable to read opaque %s data (%d bytes)";
                    eVar8 = 10;
LAB_0011a3ba:
                    eVar8 = (*ctxt->print_error)(ctxt,eVar8,pcVar19,name,type,(ulong)uVar16,outsz);
                  }
                }
                break;
              default:
                eVar8 = 3;
                pcVar20 = "Invalid type \'%s\' for attribute \'%s\'";
LAB_0011a116:
                eVar8 = (*ctxt->print_error)(ctxt,eVar8,pcVar20,pcVar19,pcVar21);
              }
LAB_00119e3b:
            } while (eVar8 == 0);
            exr_attr_list_remove((exr_context_t)ctxt,&p_Var22->attributes,nattr);
LAB_00118eb6:
          } while (ctxt->strict_header == '\0');
LAB_0011ab42:
          if (scratch.scratch != (uint8_t *)0x0) {
            (*(scratch.ctxt)->free_fn)(scratch.scratch);
          }
LAB_0011ab5a:
          eVar8 = internal_exr_context_restore_handlers(ctxt,eVar8);
          return eVar8;
        }
        if (ctxt->strict_header == '\0') {
          ctxt->is_singlepart_tiled = '\0';
          goto LAB_00118d03;
        }
        eVar8 = (*ctxt->print_error)
                          (ctxt,6,
                           "Invalid combination of version flags: single part found, but also marked as deep (%d) or multipart (%d)"
                           ,(ulong)(uVar16 & 1),(ulong)(flags >> 0xc & 1));
      }
      if (puVar11 != (uint8_t *)0x0) {
        (*ctxt->free_fn)(puVar11);
      }
    }
  }
  eVar8 = internal_exr_context_restore_handlers(ctxt,eVar8);
  return eVar8;
LAB_0011aa31:
  eVar8 = 0;
  if (ctxt->num_parts <= lVar24) goto LAB_0011ab42;
  curpart_00 = ctxt->parts[lVar24];
  eVar8 = internal_exr_compute_tile_information(ctxt,curpart_00,0);
  if (eVar8 != 0) goto LAB_0011ab42;
  uVar16 = internal_exr_compute_chunk_offset_size(curpart_00);
  if ((int)uVar16 < 0) {
    if (curpart_00->name == (exr_attribute_t *)0x0) {
      pcVar19 = "<first>";
    }
    else {
      pcVar19 = (char *)((curpart_00->name->field_6).chlist)->entries;
    }
    eVar8 = (*ctxt->print_error)
                      (ctxt,0xe,"Invalid chunk count (%d) for part \'%s\'",(ulong)uVar16,pcVar19);
    goto LAB_0011ab42;
  }
  uVar4 = curpart_00->chunk_count;
  if ((int)uVar4 < 0) {
LAB_0011aab1:
    curpart_00->chunk_count = uVar16;
  }
  else if (uVar4 != uVar16) {
    pcVar19 = "<first>";
    if (curpart_00->name != (exr_attribute_t *)0x0) {
      pcVar19 = (char *)((curpart_00->name->field_6).chlist)->entries;
    }
    (*ctxt->print_error)
              (ctxt,0xe,"Invalid chunk count (%d) for part \'%s\', expect (%d)",(ulong)uVar4,pcVar19
               ,(ulong)uVar16);
    goto LAB_0011aab1;
  }
  if (p_Var22 != curpart_00) {
    curpart_00->chunk_table_offset = (long)p_Var22->chunk_count * 8 + p_Var22->chunk_table_offset;
  }
  lVar24 = lVar24 + 1;
  p_Var22 = curpart_00;
  goto LAB_0011aa31;
}

Assistant:

exr_result_t
internal_exr_parse_header (struct _internal_exr_context* ctxt)
{
    struct _internal_exr_seq_scratch scratch;
    struct _internal_exr_part*       curpart;
    uint32_t                         flags;
    uint64_t                         initpos;
    uint8_t                          next_byte;
    exr_result_t                     rv = EXR_ERR_UNKNOWN;

    if (ctxt->silent_header)
    {
        ctxt->standard_error = &silent_standard_error;
        ctxt->report_error   = &silent_error;
        ctxt->print_error    = &silent_print_error;
    }
    rv = read_magic_and_flags (ctxt, &flags, &initpos);
    if (rv != EXR_ERR_SUCCESS)
        return internal_exr_context_restore_handlers (ctxt, rv);

    rv = priv_init_scratch (ctxt, &scratch, initpos);
    if (rv != EXR_ERR_SUCCESS)
    {
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    curpart = ctxt->parts[0];
    if (!curpart)
    {
        rv = ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Error during file initialization");
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    ctxt->is_singlepart_tiled = (flags & EXR_TILED_FLAG) ? 1 : 0;
    if (ctxt->strict_header)
    {
        ctxt->max_name_length = (flags & EXR_LONG_NAMES_FLAG)
                                    ? EXR_LONGNAME_MAXLEN
                                    : EXR_SHORTNAME_MAXLEN;
    }
    else
    {
        ctxt->max_name_length = EXR_LONGNAME_MAXLEN;
    }
    ctxt->has_nonimage_data = (flags & EXR_NON_IMAGE_FLAG) ? 1 : 0;
    ctxt->is_multipart      = (flags & EXR_MULTI_PART_FLAG) ? 1 : 0;
    if (ctxt->is_singlepart_tiled)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            if (ctxt->strict_header)
            {
                rv = ctxt->print_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Invalid combination of version flags: single part found, but also marked as deep (%d) or multipart (%d)",
                    (int) ctxt->has_nonimage_data,
                    (int) ctxt->is_multipart);
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }
            else
            {
                // assume multipart for now
                ctxt->is_singlepart_tiled = 0;
            }
        }
        curpart->storage_mode = EXR_STORAGE_TILED;
    }
    else
        curpart->storage_mode = EXR_STORAGE_SCANLINE;

    do
    {
        rv = scratch.sequential_read (&scratch, &next_byte, 1);
        if (rv != EXR_ERR_SUCCESS)
        {
            rv = ctxt->report_error (
                ctxt, EXR_ERR_FILE_BAD_HEADER, "Unable to extract header byte");
            priv_destroy_scratch (&scratch);
            return internal_exr_context_restore_handlers (ctxt, rv);
        }

        if (next_byte == '\0')
        {
            rv = internal_exr_validate_read_part (ctxt, curpart);
            if (rv != EXR_ERR_SUCCESS)
            {
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (!ctxt->is_multipart)
            {
                /* got a terminal mark, not multipart, so finished */
                break;
            }

            rv = scratch.sequential_read (&scratch, &next_byte, 1);
            if (rv != EXR_ERR_SUCCESS)
            {
                rv = ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Unable to go to next part definition");
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (next_byte == '\0')
            {
                /* got a second terminator, finished with the
                 * headers, can read chunk offsets next */
                break;
            }

            rv = internal_exr_add_part (ctxt, &curpart, NULL);
        }

        if (rv == EXR_ERR_SUCCESS)
            rv = pull_attr (ctxt, curpart, next_byte, &scratch);
        if (rv != EXR_ERR_SUCCESS)
        {
            if (ctxt->strict_header) { break; }
            rv = EXR_ERR_SUCCESS;
        }
    } while (1);

    if (rv == EXR_ERR_SUCCESS) { rv = update_chunk_offsets (ctxt, &scratch); }

    priv_destroy_scratch (&scratch);
    return internal_exr_context_restore_handlers (ctxt, rv);
}